

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cc
# Opt level: O1

void __thiscall avro::MemoryInputStream::skip(MemoryInputStream *this,size_t len)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  
  do {
    if (len == 0) {
      return;
    }
    sVar1 = maxLen(this);
    if (sVar1 != 0) {
      uVar3 = len + this->curLen_;
      sVar2 = sVar1;
      if (uVar3 < sVar1) {
        sVar2 = uVar3;
      }
      len = uVar3 - sVar2;
      this->curLen_ = sVar2;
    }
  } while (sVar1 != 0);
  return;
}

Assistant:

void skip(size_t len) {
        while (len > 0) {
            if (size_t n = maxLen()) {
                if ((curLen_ + len) < n) {
                    n = curLen_ + len;
                }
                len -= n - curLen_;
                curLen_ = n;
            } else {
                break;
            }
        }
    }